

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Parser::_line_ended_undo(Parser *this)

{
  size_t *psVar1;
  char cVar2;
  code *pcVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  bool bVar8;
  State *pSVar9;
  long lVar10;
  size_t sVar11;
  ulong uVar12;
  char *pcVar13;
  char *pcVar14;
  size_t sVar15;
  byte bVar16;
  char msg [39];
  char local_98 [104];
  undefined4 local_30;
  undefined1 local_2c;
  undefined4 local_20;
  undefined1 local_1c;
  
  bVar16 = 0;
  pSVar9 = this->m_state;
  if ((pSVar9->pos).super_LineCol.col != 1) {
    builtin_strncpy(local_98,"check failed: (m_state->pos.col == 1u)",0x27);
    if (((byte)s_error_flags & 1) != 0) {
      bVar8 = is_debugger_attached();
      if (bVar8) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
    }
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x76ae) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x76ae) << 0x40,8);
    LVar4.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar4.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_98,0x27,LVar4,(this->m_stack).m_callbacks.m_user_data);
    pSVar9 = this->m_state;
  }
  if ((pSVar9->pos).super_LineCol.line == 0) {
    builtin_strncpy(local_98,"check failed: (m_state->pos.line > 0u)",0x27);
    if (((byte)s_error_flags & 1) != 0) {
      bVar8 = is_debugger_attached();
      if (bVar8) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
    }
    LVar5.super_LineCol.col = 0;
    LVar5.super_LineCol.offset = SUB168(ZEXT816(0x76af) << 0x40,0);
    LVar5.super_LineCol.line = SUB168(ZEXT816(0x76af) << 0x40,8);
    LVar5.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar5.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_98,0x27,LVar5,(this->m_stack).m_callbacks.m_user_data);
    pSVar9 = this->m_state;
  }
  uVar12 = (pSVar9->pos).super_LineCol.offset;
  sVar15 = (pSVar9->line_contents).full.len;
  sVar11 = (pSVar9->line_contents).stripped.len;
  if (uVar12 < sVar15 - sVar11) {
    pcVar13 = 
    "check failed: (m_state->pos.offset >= m_state->line_contents.full.len - m_state->line_contents.stripped.len)"
    ;
    pcVar14 = local_98;
    for (lVar10 = 0xd; lVar10 != 0; lVar10 = lVar10 + -1) {
      *(undefined8 *)pcVar14 = *(undefined8 *)pcVar13;
      pcVar13 = pcVar13 + ((ulong)bVar16 * -2 + 1) * 8;
      pcVar14 = pcVar14 + ((ulong)bVar16 * -2 + 1) * 8;
    }
    local_2c = 0;
    local_30 = 0x296e656c;
    if (((byte)s_error_flags & 1) != 0) {
      bVar8 = is_debugger_attached();
      if (bVar8) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
    }
    LVar6.super_LineCol.col = 0;
    LVar6.super_LineCol.offset = SUB168(ZEXT816(0x76b0) << 0x40,0);
    LVar6.super_LineCol.line = SUB168(ZEXT816(0x76b0) << 0x40,8);
    LVar6.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar6.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_98,0x6d,LVar6,(this->m_stack).m_callbacks.m_user_data);
    pSVar9 = this->m_state;
    uVar12 = (pSVar9->pos).super_LineCol.offset;
    sVar15 = (pSVar9->line_contents).full.len;
    sVar11 = (pSVar9->line_contents).stripped.len;
  }
  sVar15 = (sVar11 - sVar15) + uVar12;
  (pSVar9->pos).super_LineCol.offset = sVar15;
  psVar1 = &(pSVar9->pos).super_LineCol.line;
  *psVar1 = *psVar1 - 1;
  (pSVar9->pos).super_LineCol.col = sVar11 + 1;
  uVar12 = (this->m_buf).len;
  if (((sVar15 < uVar12) && (cVar2 = (this->m_buf).str[sVar15], cVar2 != '\n')) && (cVar2 != '\r'))
  {
    pcVar13 = 
    "check failed: (m_state->pos.offset >= m_buf.len || m_buf[m_state->pos.offset] == \'\\n\' || m_buf[m_state->pos.offset] == \'\\r\')"
    ;
    pcVar14 = local_98;
    for (lVar10 = 0xf; lVar10 != 0; lVar10 = lVar10 + -1) {
      *(undefined8 *)pcVar14 = *(undefined8 *)pcVar13;
      pcVar13 = pcVar13 + ((ulong)bVar16 * -2 + 1) * 8;
      pcVar14 = pcVar14 + ((ulong)bVar16 * -2 + 1) * 8;
    }
    local_1c = 0;
    local_20 = 0x2927725c;
    if (((byte)s_error_flags & 1) != 0) {
      bVar8 = is_debugger_attached();
      if (bVar8) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
    }
    LVar7.super_LineCol.col = 0;
    LVar7.super_LineCol.offset = SUB168(ZEXT816(0x76b7) << 0x40,0);
    LVar7.super_LineCol.line = SUB168(ZEXT816(0x76b7) << 0x40,8);
    LVar7.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar7.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_98,0x7d,LVar7,(this->m_stack).m_callbacks.m_user_data);
    pSVar9 = this->m_state;
    sVar15 = (pSVar9->pos).super_LineCol.offset;
    uVar12 = (this->m_buf).len;
  }
  if (sVar15 <= uVar12) {
    (pSVar9->line_contents).rem.str = (this->m_buf).str + sVar15;
    (pSVar9->line_contents).rem.len = 0;
    return;
  }
  if (((byte)s_error_flags & 1) != 0) {
    bVar8 = is_debugger_attached();
    if (bVar8) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
  }
  handle_error(0x1f7f77,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
               ,0x153a,"first >= 0 && first <= len");
}

Assistant:

void Parser::_line_ended_undo()
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->pos.col == 1u);
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->pos.line > 0u);
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->pos.offset >= m_state->line_contents.full.len - m_state->line_contents.stripped.len);
    size_t delta = m_state->line_contents.full.len - m_state->line_contents.stripped.len;
    _c4dbgpf("line[{}] undo ended! line {}-->{}, offset {}-->{}", m_state->pos.line, m_state->pos.line, m_state->pos.line - 1, m_state->pos.offset, m_state->pos.offset - delta);
    m_state->pos.offset -= delta;
    --m_state->pos.line;
    m_state->pos.col = m_state->line_contents.stripped.len + 1u;
    // don't forget to undo also the changes to the remainder of the line
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->pos.offset >= m_buf.len || m_buf[m_state->pos.offset] == '\n' || m_buf[m_state->pos.offset] == '\r');
    m_state->line_contents.rem = m_buf.sub(m_state->pos.offset, 0);
}